

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_postprocess.cpp
# Opt level: O3

void __thiscall FGLRenderer::BloomScene(FGLRenderer *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  FGLRenderBuffers *pFVar9;
  FGLRenderBuffers *pFVar10;
  FBloomCombineShader *pFVar11;
  undefined1 auVar12 [16];
  float blurAmount;
  int sampleCount;
  FBloomExtractShader *pFVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  undefined1 in_XMM2 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  FGLPostProcessState savedState;
  FGLPostProcessState local_60;
  
  if ((gl_bloom.Value) && (gl_fixedcolormap == 0)) {
    FString::FString((FString *)&local_60,"BloomScene");
    FGLDebug::PushGroup((FString *)&local_60);
    FString::~FString((FString *)&local_60);
    FGLPostProcessState::FGLPostProcessState(&local_60);
    sampleCount = gl_bloom_kernel_size.Value;
    blurAmount = gl_bloom_amount.Value;
    pFVar9 = this->mBuffers;
    (*_ptrc_glBindFramebuffer)(0x8d40,pFVar9->BloomLevels[0].VFramebuffer);
    (*_ptrc_glViewport)(0,0,pFVar9->BloomLevels[0].Width,pFVar9->BloomLevels[0].Height);
    FGLRenderBuffers::BindCurrentTexture(this->mBuffers,0);
    (*_ptrc_glTexParameteri)(0xde1,0x2801,0x2601);
    (*_ptrc_glTexParameteri)(0xde1,0x2800,0x2601);
    FBloomExtractShader::Bind(this->mBloomExtractShader);
    pFVar13 = this->mBloomExtractShader;
    if ((pFVar13->SceneTexture).mBuffer != 0) {
      (pFVar13->SceneTexture).mBuffer = 0;
      (*_ptrc_glUniform1i)((pFVar13->SceneTexture).mIndex,0);
      pFVar13 = this->mBloomExtractShader;
    }
    fVar15 = this->mCameraExposure;
    if ((pFVar13->Exposure).mBuffer != fVar15) {
      (pFVar13->Exposure).mBuffer = fVar15;
      (*_ptrc_glUniform1f)((pFVar13->Exposure).mIndex,fVar15);
      pFVar13 = this->mBloomExtractShader;
    }
    uVar1 = (this->mScreenViewport).width;
    uVar5 = (this->mScreenViewport).height;
    fVar15 = (float)(int)uVar1;
    fVar16 = (float)(int)uVar5;
    auVar18._4_4_ = fVar16;
    auVar18._0_4_ = fVar15;
    auVar18._8_8_ = 0;
    auVar17 = rcpps(in_XMM2,auVar18);
    uVar2 = (this->mSceneViewport).width;
    uVar6 = (this->mSceneViewport).height;
    fVar19 = (float)(int)uVar2 * auVar17._0_4_;
    fVar20 = (float)(int)uVar6 * auVar17._4_4_;
    fVar19 = ((float)(int)uVar2 - fVar15 * fVar19) * auVar17._0_4_ + fVar19;
    fVar20 = ((float)(int)uVar6 - fVar16 * fVar20) * auVar17._4_4_ + fVar20;
    if ((fVar19 != (pFVar13->Scale).mBuffer[0]) ||
       (auVar17._4_4_ = fVar20, auVar17._0_4_ = fVar20, auVar17._8_4_ = fVar20,
       auVar17._12_4_ = fVar20, (pFVar13->Scale).mBuffer[1] != fVar20)) {
      *(ulong *)(pFVar13->Scale).mBuffer = CONCAT44(fVar20,fVar19);
      (*_ptrc_glUniform2fv)((pFVar13->Scale).mIndex,1,(pFVar13->Scale).mBuffer);
      pFVar13 = this->mBloomExtractShader;
      uVar3 = (this->mScreenViewport).width;
      uVar7 = (this->mScreenViewport).height;
      fVar15 = (float)(int)uVar3;
      fVar16 = (float)(int)uVar7;
    }
    uVar4 = (this->mSceneViewport).left;
    uVar8 = (this->mSceneViewport).top;
    auVar12._4_4_ = fVar16;
    auVar12._0_4_ = fVar15;
    auVar12._8_8_ = 0;
    auVar18 = rcpps(auVar17,auVar12);
    fVar19 = (float)(int)uVar4 * auVar18._0_4_;
    fVar20 = (float)(int)uVar8 * auVar18._4_4_;
    fVar19 = ((float)(int)uVar4 - fVar15 * fVar19) * auVar18._0_4_ + fVar19;
    fVar20 = ((float)(int)uVar8 - fVar16 * fVar20) * auVar18._4_4_ + fVar20;
    if ((fVar19 != (pFVar13->Offset).mBuffer[0]) || ((pFVar13->Offset).mBuffer[1] != fVar20)) {
      *(ulong *)(pFVar13->Offset).mBuffer = CONCAT44(fVar20,fVar19);
      (*_ptrc_glUniform2fv)((pFVar13->Offset).mIndex,1,(pFVar13->Offset).mBuffer);
    }
    (*(this->mVBO->super_FVertexBuffer)._vptr_FVertexBuffer[2])();
    gl_RenderState.mCurrentVertexBuffer = (FVertexBuffer *)0x0;
    (*_ptrc_glDrawArrays)(5,8,4);
    (*_ptrc_glTexParameteri)(0xde1,0x2801,0x2600);
    (*_ptrc_glTexParameteri)(0xde1,0x2800,0x2600);
    lVar14 = 0;
    while (lVar14 + 0x18 != 0x60) {
      pFVar10 = this->mBuffers;
      FBlurShader::BlurHorizontal
                (this->mBlurShader,this,blurAmount,sampleCount,
                 *(GLuint *)((long)&pFVar10->BloomLevels[0].VTexture + lVar14),
                 *(GLuint *)((long)&pFVar10->BloomLevels[0].HFramebuffer + lVar14),
                 *(int *)((long)&pFVar10->BloomLevels[0].Width + lVar14),
                 *(int *)((long)&pFVar10->BloomLevels[0].Height + lVar14));
      FBlurShader::BlurVertical
                (this->mBlurShader,this,blurAmount,sampleCount,
                 *(GLuint *)((long)&pFVar10->BloomLevels[0].HTexture + lVar14),
                 *(GLuint *)((long)&pFVar10->BloomLevels[1].VFramebuffer + lVar14),
                 *(int *)((long)&pFVar10->BloomLevels[1].Width + lVar14),
                 *(int *)((long)&pFVar10->BloomLevels[1].Height + lVar14));
      lVar14 = lVar14 + 0x18;
    }
    lVar14 = 0;
    while (lVar14 + -0x18 != -0x60) {
      pFVar10 = this->mBuffers;
      FBlurShader::BlurHorizontal
                (this->mBlurShader,this,blurAmount,sampleCount,
                 *(GLuint *)((long)&pFVar10->BloomLevels[3].VTexture + lVar14),
                 *(GLuint *)((long)&pFVar10->BloomLevels[3].HFramebuffer + lVar14),
                 *(int *)((long)&pFVar10->BloomLevels[3].Width + lVar14),
                 *(int *)((long)&pFVar10->BloomLevels[3].Height + lVar14));
      FBlurShader::BlurVertical
                (this->mBlurShader,this,blurAmount,sampleCount,
                 *(GLuint *)((long)&pFVar10->BloomLevels[3].HTexture + lVar14),
                 *(GLuint *)((long)&pFVar10->BloomLevels[3].VFramebuffer + lVar14),
                 *(int *)((long)&pFVar10->BloomLevels[3].Width + lVar14),
                 *(int *)((long)&pFVar10->BloomLevels[3].Height + lVar14));
      (*_ptrc_glBindFramebuffer)
                (0x8d40,*(GLuint *)((long)&pFVar10->BloomLevels[2].VFramebuffer + lVar14));
      (*_ptrc_glViewport)(0,0,*(GLsizei *)((long)&pFVar10->BloomLevels[2].Width + lVar14),
                          *(GLsizei *)((long)&pFVar10->BloomLevels[2].Height + lVar14));
      (*_ptrc_glActiveTexture)(0x84c0);
      (*_ptrc_glBindTexture)(0xde1,*(GLuint *)((long)&pFVar10->BloomLevels[3].VTexture + lVar14));
      (*_ptrc_glTexParameteri)(0xde1,0x2801,0x2601);
      (*_ptrc_glTexParameteri)(0xde1,0x2800,0x2601);
      FBloomCombineShader::Bind(this->mBloomCombineShader);
      pFVar11 = this->mBloomCombineShader;
      if ((pFVar11->BloomTexture).mBuffer != 0) {
        (pFVar11->BloomTexture).mBuffer = 0;
        (*_ptrc_glUniform1i)((pFVar11->BloomTexture).mIndex,0);
      }
      (*(this->mVBO->super_FVertexBuffer)._vptr_FVertexBuffer[2])();
      gl_RenderState.mCurrentVertexBuffer = (FVertexBuffer *)0x0;
      (*_ptrc_glDrawArrays)(5,8,4);
      lVar14 = lVar14 + -0x18;
    }
    FBlurShader::BlurHorizontal
              (this->mBlurShader,this,blurAmount,sampleCount,pFVar9->BloomLevels[0].VTexture,
               pFVar9->BloomLevels[0].HFramebuffer,pFVar9->BloomLevels[0].Width,
               pFVar9->BloomLevels[0].Height);
    FBlurShader::BlurVertical
              (this->mBlurShader,this,blurAmount,sampleCount,pFVar9->BloomLevels[0].HTexture,
               pFVar9->BloomLevels[0].VFramebuffer,pFVar9->BloomLevels[0].Width,
               pFVar9->BloomLevels[0].Height);
    FGLRenderBuffers::BindCurrentFB(this->mBuffers);
    (*_ptrc_glViewport)((this->mSceneViewport).left,(this->mSceneViewport).top,
                        (this->mSceneViewport).width,(this->mSceneViewport).height);
    (*_ptrc_glEnable)(0xbe2);
    (*_ptrc_glBlendEquation)(0x8006);
    (*_ptrc_glBlendFunc)(1,1);
    (*_ptrc_glActiveTexture)(0x84c0);
    (*_ptrc_glBindTexture)(0xde1,pFVar9->BloomLevels[0].VTexture);
    (*_ptrc_glTexParameteri)(0xde1,0x2801,0x2601);
    (*_ptrc_glTexParameteri)(0xde1,0x2800,0x2601);
    FBloomCombineShader::Bind(this->mBloomCombineShader);
    pFVar11 = this->mBloomCombineShader;
    if ((pFVar11->BloomTexture).mBuffer != 0) {
      (pFVar11->BloomTexture).mBuffer = 0;
      (*_ptrc_glUniform1i)((pFVar11->BloomTexture).mIndex,0);
    }
    (*(this->mVBO->super_FVertexBuffer)._vptr_FVertexBuffer[2])();
    gl_RenderState.mCurrentVertexBuffer = (FVertexBuffer *)0x0;
    (*_ptrc_glDrawArrays)(5,8,4);
    (*_ptrc_glViewport)((this->mScreenViewport).left,(this->mScreenViewport).top,
                        (this->mScreenViewport).width,(this->mScreenViewport).height);
    FGLDebug::PopGroup();
    FGLPostProcessState::~FGLPostProcessState(&local_60);
  }
  return;
}

Assistant:

void FGLRenderer::BloomScene()
{
	// Only bloom things if enabled and no special fixed light mode is active
	if (!gl_bloom || gl_fixedcolormap != CM_DEFAULT)
		return;

	FGLDebug::PushGroup("BloomScene");

	FGLPostProcessState savedState;

	const float blurAmount = gl_bloom_amount;
	int sampleCount = gl_bloom_kernel_size;

	const auto &level0 = mBuffers->BloomLevels[0];

	// Extract blooming pixels from scene texture:
	glBindFramebuffer(GL_FRAMEBUFFER, level0.VFramebuffer);
	glViewport(0, 0, level0.Width, level0.Height);
	mBuffers->BindCurrentTexture(0);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
	mBloomExtractShader->Bind();
	mBloomExtractShader->SceneTexture.Set(0);
	mBloomExtractShader->Exposure.Set(mCameraExposure);
	mBloomExtractShader->Scale.Set(mSceneViewport.width / (float)mScreenViewport.width, mSceneViewport.height / (float)mScreenViewport.height);
	mBloomExtractShader->Offset.Set(mSceneViewport.left / (float)mScreenViewport.width, mSceneViewport.top / (float)mScreenViewport.height);
	RenderScreenQuad();
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

	// Blur and downscale:
	for (int i = 0; i < FGLRenderBuffers::NumBloomLevels - 1; i++)
	{
		const auto &level = mBuffers->BloomLevels[i];
		const auto &next = mBuffers->BloomLevels[i + 1];
		mBlurShader->BlurHorizontal(this, blurAmount, sampleCount, level.VTexture, level.HFramebuffer, level.Width, level.Height);
		mBlurShader->BlurVertical(this, blurAmount, sampleCount, level.HTexture, next.VFramebuffer, next.Width, next.Height);
	}

	// Blur and upscale:
	for (int i = FGLRenderBuffers::NumBloomLevels - 1; i > 0; i--)
	{
		const auto &level = mBuffers->BloomLevels[i];
		const auto &next = mBuffers->BloomLevels[i - 1];

		mBlurShader->BlurHorizontal(this, blurAmount, sampleCount, level.VTexture, level.HFramebuffer, level.Width, level.Height);
		mBlurShader->BlurVertical(this, blurAmount, sampleCount, level.HTexture, level.VFramebuffer, level.Width, level.Height);

		// Linear upscale:
		glBindFramebuffer(GL_FRAMEBUFFER, next.VFramebuffer);
		glViewport(0, 0, next.Width, next.Height);
		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_2D, level.VTexture);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
		mBloomCombineShader->Bind();
		mBloomCombineShader->BloomTexture.Set(0);
		RenderScreenQuad();
	}

	mBlurShader->BlurHorizontal(this, blurAmount, sampleCount, level0.VTexture, level0.HFramebuffer, level0.Width, level0.Height);
	mBlurShader->BlurVertical(this, blurAmount, sampleCount, level0.HTexture, level0.VFramebuffer, level0.Width, level0.Height);

	// Add bloom back to scene texture:
	mBuffers->BindCurrentFB();
	glViewport(mSceneViewport.left, mSceneViewport.top, mSceneViewport.width, mSceneViewport.height);
	glEnable(GL_BLEND);
	glBlendEquation(GL_FUNC_ADD);
	glBlendFunc(GL_ONE, GL_ONE);
	glActiveTexture(GL_TEXTURE0);
	glBindTexture(GL_TEXTURE_2D, level0.VTexture);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
	mBloomCombineShader->Bind();
	mBloomCombineShader->BloomTexture.Set(0);
	RenderScreenQuad();
	glViewport(mScreenViewport.left, mScreenViewport.top, mScreenViewport.width, mScreenViewport.height);

	FGLDebug::PopGroup();
}